

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

Header * __thiscall Imf_3_4::TiledInputFile::header(TiledInputFile *this)

{
  int iVar1;
  mutex *__mutex;
  element_type *peVar2;
  Header local_50;
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_mx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    peVar2 = (this->_data).
             super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2->header_filled == false) {
      Context::header(&local_50,&this->_ctxt,peVar2->partNumber);
      Header::operator=(&((this->_data).
                          super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->header,&local_50);
      Header::~Header(&local_50);
      peVar2 = (this->_data).
               super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2->header_filled = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return &peVar2->header;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const Header&
TiledInputFile::header () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    if (!_data->header_filled)
    {
        _data->header = _ctxt.header (_data->partNumber);
        _data->header_filled = true;
    }
    return _data->header;
}